

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O1

int Sbd_ManMergeCuts(Sbd_Man_t *p,int Node)

{
  undefined8 uVar1;
  Sbd_Par_t *pSVar2;
  int *piVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  int *piVar14;
  Sbd_Man_t *p_00;
  uint uVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  int Cut1 [2];
  int Cut0 [2];
  int pCut10 [13];
  int pCut01 [13];
  int pCut11 [13];
  int pCut00 [13];
  int local_138;
  uint local_134;
  int local_130;
  uint local_12c;
  int local_128 [16];
  int local_e8 [16];
  int local_a8 [16];
  int local_68 [14];
  
  if ((Node < 0) || (p->pGia->nObjs <= Node)) {
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  uVar1 = *(undefined8 *)(p->pGia->pObjs + (uint)Node);
  uVar13 = (uint)uVar1 & 0x1fffffff;
  uVar4 = Node - uVar13;
  if (-1 < (int)uVar4) {
    iVar12 = p->vLutLevs->nSize;
    if ((int)uVar4 < iVar12) {
      uVar18 = (uint)((ulong)uVar1 >> 0x20) & 0x1fffffff;
      uVar9 = Node - uVar18;
      piVar14 = p->vLutLevs->pArray;
      iVar17 = piVar14[uVar4];
      iVar17 = iVar17 + (uint)(iVar17 == 0);
      if ((-1 < (int)uVar9) && ((int)uVar9 < iVar12)) {
        iVar12 = piVar14[uVar9];
        iVar12 = iVar12 + (uint)(iVar12 == 0);
        iVar10 = p->pPars->nLutSize + 1;
        uVar15 = iVar10 * uVar4;
        if (-1 < (int)uVar15) {
          iVar19 = p->vLutCuts->nSize;
          if ((((int)uVar15 < iVar19) && (uVar11 = iVar10 * uVar9, -1 < (int)uVar11)) &&
             ((int)uVar11 < iVar19)) {
            p_00 = (Sbd_Man_t *)p->vLutCuts->pArray;
            piVar14 = (int *)((long)p_00->vSims + (ulong)uVar15 * 4 + -0x38);
            piVar3 = (int *)((long)p_00->vSims + (ulong)uVar11 * 4 + -0x38);
            local_130 = 1;
            local_138 = 1;
            local_134 = uVar9;
            local_12c = uVar4;
            iVar5 = Sbd_CutMergeSimple(p_00,piVar14,piVar3,local_a8);
            iVar6 = Sbd_CutMergeSimple(p_00,&local_130,piVar3,local_e8);
            iVar7 = Sbd_CutMergeSimple(p_00,piVar14,&local_138,local_128);
            iVar8 = Sbd_CutMergeSimple(p_00,&local_130,&local_138,local_68);
            pSVar2 = p->pPars;
            iVar10 = pSVar2->nLutSize;
            iVar19 = iVar12;
            if (iVar12 < iVar17) {
              iVar19 = iVar17;
            }
            if (iVar10 < iVar5) {
              iVar19 = 1000000000;
            }
            iVar5 = iVar17 + 1;
            iVar16 = iVar12;
            if (iVar12 < iVar5) {
              iVar16 = iVar5;
            }
            if (iVar10 < iVar6) {
              iVar16 = 1000000000;
            }
            iVar12 = iVar12 + 1;
            if (iVar17 <= iVar12) {
              iVar17 = iVar12;
            }
            if (iVar10 < iVar7) {
              iVar17 = 1000000000;
            }
            iVar6 = 1000000000;
            if ((iVar8 <= iVar10) && (iVar6 = iVar12, iVar12 < iVar5)) {
              iVar6 = iVar5;
            }
            piVar14 = local_a8;
            if ((iVar16 < iVar19) || ((iVar16 == iVar19 && (local_e8[0] < local_a8[0])))) {
              piVar14 = local_e8;
              iVar19 = iVar16;
            }
            if ((iVar17 < iVar19) || ((iVar17 == iVar19 && (local_128[0] < *piVar14)))) {
              piVar14 = local_128;
              iVar19 = iVar17;
            }
            if ((iVar6 < iVar19) || ((iVar6 == iVar19 && (local_68[0] < *piVar14)))) {
              piVar14 = local_68;
              iVar19 = iVar6;
            }
            if (uVar18 == uVar13) {
              __assert_fail("iFan0 != iFan1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                            ,0x6ad,"int Sbd_ManMergeCuts(Sbd_Man_t *, int)");
            }
            if (p->vLutLevs->nSize <= Node) goto LAB_0053c6f9;
            piVar3 = p->vLutLevs->pArray;
            if (piVar3[(uint)Node] != 0) {
              __assert_fail("Vec_IntEntry(p->vLutLevs, Node) == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                            ,0x6ae,"int Sbd_ManMergeCuts(Sbd_Man_t *, int)");
            }
            piVar3[(uint)Node] = iVar19;
            iVar12 = pSVar2->nLutSize;
            if (iVar12 < *piVar14) {
              __assert_fail("pCutRes[0] <= p->pPars->nLutSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                            ,0x6b1,"int Sbd_ManMergeCuts(Sbd_Man_t *, int)");
            }
            uVar4 = (iVar12 + 1) * Node;
            if ((-1 < (int)uVar4) && ((int)uVar4 < p->vLutCuts->nSize)) {
              memcpy(p->vLutCuts->pArray + uVar4,piVar14,(long)*piVar14 * 4 + 4);
              return (int)(iVar19 == 1);
            }
          }
        }
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
    }
  }
LAB_0053c6f9:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Sbd_ManMergeCuts( Sbd_Man_t * p, int Node )
{
    int pCut11[2*SBD_MAX_LUTSIZE+1];     
    int pCut01[2*SBD_MAX_LUTSIZE+1];     
    int pCut10[2*SBD_MAX_LUTSIZE+1];     
    int pCut00[2*SBD_MAX_LUTSIZE+1];     
    int iFan0   = Gia_ObjFaninId0( Gia_ManObj(p->pGia, Node), Node );
    int iFan1   = Gia_ObjFaninId1( Gia_ManObj(p->pGia, Node), Node );
    int Level0  = Vec_IntEntry( p->vLutLevs, iFan0 ) ? Vec_IntEntry( p->vLutLevs, iFan0 ) : 1;
    int Level1  = Vec_IntEntry( p->vLutLevs, iFan1 ) ? Vec_IntEntry( p->vLutLevs, iFan1 ) : 1;
    int * pCut0 = Sbd_ObjCut( p, iFan0 );
    int * pCut1 = Sbd_ObjCut( p, iFan1 );
    int Cut0[2] = {1, iFan0}; 
    int Cut1[2] = {1, iFan1}; 
    int nSize11 = Sbd_CutMergeSimple( p, pCut0, pCut1, pCut11 );
    int nSize01 = Sbd_CutMergeSimple( p,  Cut0, pCut1, pCut01 );
    int nSize10 = Sbd_CutMergeSimple( p, pCut0,  Cut1, pCut10 );
    int nSize00 = Sbd_CutMergeSimple( p,  Cut0,  Cut1, pCut00 );
    int Lev11   = nSize11 <= p->pPars->nLutSize ? Abc_MaxInt(Level0,   Level1)   : ABC_INFINITY;
    int Lev01   = nSize01 <= p->pPars->nLutSize ? Abc_MaxInt(Level0+1, Level1)   : ABC_INFINITY;
    int Lev10   = nSize10 <= p->pPars->nLutSize ? Abc_MaxInt(Level0,   Level1+1) : ABC_INFINITY;
    int Lev00   = nSize00 <= p->pPars->nLutSize ? Abc_MaxInt(Level0+1, Level1+1) : ABC_INFINITY;
    int * pCutRes = pCut11;
    int LevCur    = Lev11;
    if ( Lev01 < LevCur || (Lev01 == LevCur && pCut01[0] < pCutRes[0]) )
    {
        pCutRes = pCut01;
        LevCur  = Lev01;
    }
    if ( Lev10 < LevCur || (Lev10 == LevCur && pCut10[0] < pCutRes[0]) )
    {
        pCutRes = pCut10;
        LevCur  = Lev10;
    }
    if ( Lev00 < LevCur || (Lev00 == LevCur && pCut00[0] < pCutRes[0]) )
    {
        pCutRes = pCut00;
        LevCur  = Lev00;
    }
    assert( iFan0 != iFan1 );
    assert( Vec_IntEntry(p->vLutLevs, Node) == 0 );
    Vec_IntWriteEntry( p->vLutLevs, Node, LevCur );
    //Vec_IntWriteEntry( p->vLevs, Node, 1+Abc_MaxInt(Vec_IntEntry(p->vLevs, iFan0), Vec_IntEntry(p->vLevs, iFan1)) );
    assert( pCutRes[0] <= p->pPars->nLutSize );
    memcpy( Sbd_ObjCut(p, Node), pCutRes, sizeof(int) * (pCutRes[0] + 1) );
//printf( "Setting node %d with delay %d.\n", Node, LevCur );
    return LevCur == 1; // LevCur == Abc_MaxInt(Level0, Level1);
}